

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_commodities.cpp
# Opt level: O2

void __thiscall
commodities_escapeStrings_Test::~commodities_escapeStrings_Test
          (commodities_escapeStrings_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(commodities, escapeStrings)
{
    auto hcode = getCommodity("c\\{a");
    auto cstring = getCommodityName(hcode);
    EXPECT_EQ(cstring, "c{a");

    hcode = getCommodity("c\\}ab");
    cstring = getCommodityName(hcode);
    EXPECT_EQ(cstring, "c}ab");

    hcode = getCommodity("c\\(a");
    cstring = getCommodityName(hcode);
    EXPECT_EQ(cstring, "c(a");

    hcode = getCommodity("c\\)abc");
    cstring = getCommodityName(hcode);
    EXPECT_EQ(cstring, "c)abc");

    hcode = getCommodity("c\\[a");
    cstring = getCommodityName(hcode);
    EXPECT_EQ(cstring, "c[a");

    hcode = getCommodity("c\\]abc");
    cstring = getCommodityName(hcode);
    EXPECT_EQ(cstring, "c]abc");

    hcode = getCommodity("c\\\\abc");
    cstring = getCommodityName(hcode);
    EXPECT_EQ(cstring, "c\\abc");

    hcode = getCommodity("c\\%ab");
    cstring = getCommodityName(hcode);
    EXPECT_EQ(cstring, "c\\%ab");

    hcode = getCommodity(" ty ");
    cstring = getCommodityName(hcode);
    EXPECT_EQ(cstring, "_ty");
    clearCustomCommodities();
}